

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

int dwarf_dnames_name(Dwarf_Dnames_Head dn,Dwarf_Unsigned name_index,Dwarf_Unsigned *bucket_number,
                     Dwarf_Unsigned *hash_value,Dwarf_Unsigned *offset_to_debug_str,char **ptrtostr,
                     Dwarf_Unsigned *offset_in_entrypool,Dwarf_Unsigned *abbrev_code,
                     Dwarf_Half *abbrev_tag,Dwarf_Unsigned array_size,Dwarf_Half *idxattr_array,
                     Dwarf_Half *form_array,Dwarf_Unsigned *attr_count,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Byte_Ptr readend_1;
  Dwarf_Unsigned _ltmp_1;
  Dwarf_Small *endptr_1;
  Dwarf_Small *ptr_1;
  Dwarf_Small *pDStack_b0;
  int res_s;
  Dwarf_Small *secend;
  Dwarf_Unsigned secdatalen;
  Dwarf_Small *secdataptr;
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Small *endptr;
  Dwarf_Small *ptr;
  Dwarf_Unsigned code;
  Dwarf_D_Abbrev_s *abbrevdata;
  Dwarf_Small *strpointer;
  Dwarf_Unsigned debugstroffset;
  Dwarf_Unsigned entrypooloffset;
  Dwarf_Debug pDStack_48;
  int res;
  Dwarf_Debug dbg;
  char **ptrtostr_local;
  Dwarf_Unsigned *offset_to_debug_str_local;
  Dwarf_Unsigned *hash_value_local;
  Dwarf_Unsigned *bucket_number_local;
  Dwarf_Unsigned name_index_local;
  Dwarf_Dnames_Head dn_local;
  
  pDStack_48 = (Dwarf_Debug)0x0;
  entrypooloffset._4_4_ = 0;
  debugstroffset = 0;
  strpointer = (Dwarf_Small *)0x0;
  abbrevdata = (Dwarf_D_Abbrev_s *)0x0;
  code = 0;
  ptr = (Dwarf_Small *)0x0;
  dbg = (Dwarf_Debug)ptrtostr;
  ptrtostr_local = (char **)offset_to_debug_str;
  offset_to_debug_str_local = hash_value;
  hash_value_local = bucket_number;
  bucket_number_local = (Dwarf_Unsigned *)name_index;
  name_index_local = (Dwarf_Unsigned)dn;
  if ((dn == (Dwarf_Dnames_Head)0x0) || (dn->dn_magic != 0xabcd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() Passes in a NULL or uninitialized pointer"
                       );
    dn_local._4_4_ = 1;
  }
  else {
    pDStack_48 = dn->dn_dbg;
    if ((pDStack_48 == (Dwarf_Debug)0x0) || (pDStack_48->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: a call to dwarf_dnames_name() finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head"
                         );
      dn_local._4_4_ = 1;
    }
    else if ((name_index == 0) || (dn->dn_name_count < name_index)) {
      dn_local._4_4_ = -1;
    }
    else {
      entrypooloffset._4_4_ = get_bucket_number(dn,name_index,bucket_number);
      if ((entrypooloffset._4_4_ == 0) &&
         (entrypooloffset._4_4_ =
               get_hash_value_number
                         ((Dwarf_Dnames_Head)name_index_local,(Dwarf_Unsigned)bucket_number_local,
                          offset_to_debug_str_local,error), entrypooloffset._4_4_ == 1)) {
        dn_local._4_4_ = 1;
      }
      else {
        endptr = (Dwarf_Small *)
                 (*(long *)(name_index_local + 0x118) +
                 ((long)bucket_number_local + -1) * (ulong)*(ushort *)(name_index_local + 0x50));
        _ltmp = *(ulong *)(name_index_local + 0x128);
        readend = (Dwarf_Byte_Ptr)0x0;
        secdataptr = endptr + (int)(uint)*(ushort *)(name_index_local + 0x50);
        if (secdataptr < endptr) {
          _dwarf_error_string(pDStack_48,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
          dn_local._4_4_ = 1;
        }
        else if (_ltmp < secdataptr) {
          _dwarf_error_string(pDStack_48,error,0x14b,
                              "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                             );
          dn_local._4_4_ = 1;
        }
        else {
          (*pDStack_48->de_copy_word)
                    (&readend,endptr,(unsigned_long)*(undefined2 *)(name_index_local + 0x50));
          strpointer = readend;
          if (ptrtostr_local != (char **)0x0) {
            *ptrtostr_local = (char *)readend;
          }
          ptr_1._4_4_ = 0;
          secdatalen = (Dwarf_Unsigned)(pDStack_48->de_debug_str).dss_data;
          secend = (Dwarf_Small *)(pDStack_48->de_debug_str).dss_size;
          pDStack_b0 = (Dwarf_Small *)(secdatalen + (long)secend);
          abbrevdata = (Dwarf_D_Abbrev_s *)(secdatalen + (long)readend);
          ptr_1._4_4_ = _dwarf_check_string_valid
                                  (pDStack_48,(void *)secdatalen,abbrevdata,pDStack_b0,0x169,error);
          dn_local._4_4_ = ptr_1._4_4_;
          if (ptr_1._4_4_ == 0) {
            if (dbg != (Dwarf_Debug)0x0) {
              dbg->de_magic = (Dwarf_Unsigned)abbrevdata;
            }
            endptr_1 = (Dwarf_Small *)
                       (*(long *)(name_index_local + 0x120) +
                       ((long)bucket_number_local + -1) *
                       (ulong)*(ushort *)(name_index_local + 0x50));
            _ltmp_1 = *(ulong *)(name_index_local + 0x128);
            readend_1 = (Dwarf_Byte_Ptr)0x0;
            if (endptr_1 + (int)(uint)*(ushort *)(name_index_local + 0x50) < endptr_1) {
              _dwarf_error_string(pDStack_48,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section"
                                 );
              dn_local._4_4_ = 1;
            }
            else if (_ltmp_1 < endptr_1 + (int)(uint)*(ushort *)(name_index_local + 0x50)) {
              _dwarf_error_string(pDStack_48,error,0x14b,
                                  "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section"
                                 );
              dn_local._4_4_ = 1;
            }
            else {
              (*pDStack_48->de_copy_word)
                        (&readend_1,endptr_1,(unsigned_long)*(undefined2 *)(name_index_local + 0x50)
                        );
              debugstroffset = (Dwarf_Unsigned)readend_1;
              if (readend_1 < *(Dwarf_Byte_Ptr *)(name_index_local + 0x90)) {
                if (offset_in_entrypool != (Dwarf_Unsigned *)0x0) {
                  *offset_in_entrypool = (Dwarf_Unsigned)readend_1;
                }
                entrypooloffset._4_4_ =
                     _dwarf_read_abbrev_code_from_pool
                               ((Dwarf_Dnames_Head)name_index_local,(Dwarf_Unsigned)readend_1,
                                (Dwarf_Unsigned *)&ptr,error);
                dn_local._4_4_ = entrypooloffset._4_4_;
                if (((entrypooloffset._4_4_ == 0) &&
                    (entrypooloffset._4_4_ =
                          _dwarf_find_abbrev_for_code
                                    ((Dwarf_Dnames_Head)name_index_local,(Dwarf_Unsigned)ptr,
                                     (Dwarf_D_Abbrev_s **)&code,error),
                    dn_local._4_4_ = entrypooloffset._4_4_, entrypooloffset._4_4_ != 1)) &&
                   (entrypooloffset._4_4_ != -1)) {
                  if (abbrev_code != (Dwarf_Unsigned *)0x0) {
                    *abbrev_code = (Dwarf_Unsigned)ptr;
                  }
                  if ((ptr != (Dwarf_Small *)0x0) && (abbrev_tag != (Dwarf_Half *)0x0)) {
                    *abbrev_tag = (Dwarf_Half)*(undefined8 *)(code + 0x18);
                  }
                  if (ptr != (Dwarf_Small *)0x0) {
                    if (attr_count != (Dwarf_Unsigned *)0x0) {
                      *attr_count = *(Dwarf_Unsigned *)(code + 0x20);
                    }
                    iVar1 = _dwarf_fill_in_attr_form
                                      ((Dwarf_Dnames_Head)name_index_local,(Dwarf_D_Abbrev_s *)code,
                                       idxattr_array,form_array,array_size,error);
                    if (iVar1 == 1) {
                      return 1;
                    }
                  }
                  dn_local._4_4_ = 0;
                }
              }
              else {
                _dwarf_error_string(pDStack_48,error,0x1e4,
                                    "DW_DLE_DEBUG_NAMES_ERROR: The entrypool offset read is larger thanthe entrypool size"
                                   );
                dn_local._4_4_ = 1;
              }
            }
          }
        }
      }
    }
  }
  return dn_local._4_4_;
}

Assistant:

int
dwarf_dnames_name(Dwarf_Dnames_Head dn,
    Dwarf_Unsigned      name_index,
    Dwarf_Unsigned    * bucket_number,
    Dwarf_Unsigned    * hash_value,
    Dwarf_Unsigned    * offset_to_debug_str,
    char *            * ptrtostr ,
    Dwarf_Unsigned    * offset_in_entrypool,
    Dwarf_Unsigned    * abbrev_code,
    Dwarf_Half        * abbrev_tag,
    Dwarf_Unsigned      array_size,
    Dwarf_Half        * idxattr_array,
    Dwarf_Half        * form_array,
    Dwarf_Unsigned    * attr_count,
    Dwarf_Error *       error)
{
    Dwarf_Debug dbg                     = 0;
    int res                             = 0;
    Dwarf_Unsigned entrypooloffset      = 0;
    Dwarf_Unsigned debugstroffset       = 0;
    Dwarf_Small * strpointer            = 0;
    struct Dwarf_D_Abbrev_s *abbrevdata = 0;
    Dwarf_Unsigned code                 = 0;

    if (!dn || dn->dn_magic != DWARF_DNAMES_MAGIC) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "Passes in a NULL or uninitialized pointer");
        return DW_DLV_ERROR;
    }
    dbg = dn->dn_dbg;
    if (IS_INVALID_DBG(dbg)) {
        _dwarf_error_string(NULL, error,DW_DLE_DBG_NULL,
            "DW_DLE_DBG_NULL: "
            "a call to dwarf_dnames_name() "
            "finds a NULL Dwarf_Debug in a Dwarf_Dnames_Head");
        return DW_DLV_ERROR;
    }
    if (!name_index || name_index > dn->dn_name_count) {
        return DW_DLV_NO_ENTRY;
    }
    res = get_bucket_number(dn,name_index,bucket_number);
    if (res == DW_DLV_OK) {
        res = get_hash_value_number(dn,name_index,hash_value,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    {
        Dwarf_Small *ptr = dn->dn_string_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;

        READ_UNALIGNED_CK(dbg, debugstroffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (offset_to_debug_str) {
            *offset_to_debug_str = debugstroffset;
        }
    }
    /* Get str ptr from .debug_str */
    {
        Dwarf_Small *secdataptr = 0;
        Dwarf_Unsigned secdatalen = 0;
        Dwarf_Small *secend = 0;
        int res_s = 0;

        secdataptr = (Dwarf_Small *)dbg->de_debug_str.dss_data;
        secdatalen = dbg->de_debug_str.dss_size;
        secend = secdataptr+secdatalen;
        strpointer = secdataptr +debugstroffset;
        res_s = _dwarf_check_string_valid(dbg,
            secdataptr,strpointer,secend,
            DW_DLE_FORM_STRING_BAD_STRING,error);
        if (res_s != DW_DLV_OK) {
            return res_s;
        }
        if (ptrtostr) {
            *ptrtostr = (char *)strpointer;
        }
    }

    {
        Dwarf_Small *ptr = dn->dn_entry_offsets +
            (name_index-1) * dn->dn_offset_size;
        Dwarf_Small *endptr = dn->dn_abbrevs;
        /*  offsets relative to the start of the
            entry_pool */

        READ_UNALIGNED_CK(dbg, entrypooloffset, Dwarf_Unsigned,
            ptr, dn->dn_offset_size,
            error,endptr);
        if (entrypooloffset >= dn->dn_entry_pool_size) {
            _dwarf_error_string(dbg, error,DW_DLE_DEBUG_NAMES_ERROR,
                "DW_DLE_DEBUG_NAMES_ERROR: "
                "The entrypool offset read is larger than"
                "the entrypool size");
            return DW_DLV_ERROR;
        }
        if (offset_in_entrypool) {
            *offset_in_entrypool = entrypooloffset;
        }
    }
    /*   Find abbrev code at the given entry offset */
    res = _dwarf_read_abbrev_code_from_pool(dn,
        entrypooloffset, &code,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_find_abbrev_for_code(dn,code,&abbrevdata,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }

    if (abbrev_code) {
        *abbrev_code =  code;
    }
    if (code && abbrev_tag) {
        *abbrev_tag =  (Dwarf_Half)abbrevdata->da_tag;
    }
    if (code) {
        if (attr_count) {
            *attr_count = abbrevdata->da_pairs_count;
        }
        res = _dwarf_fill_in_attr_form(dn,abbrevdata,idxattr_array,
            form_array, array_size,error);
        if (res == DW_DLV_ERROR) {
            return res;
        }
    }
    return DW_DLV_OK;
}